

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

void __thiscall Lib::DArray<Kernel::Term_*>::expand(DArray<Kernel::Term_*> *this,size_t s)

{
  size_t sVar1;
  Term **ppTVar2;
  Term **ppTVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Term **__s;
  void **head;
  ulong uVar7;
  
  uVar4 = this->_capacity;
  if (uVar4 < s) {
    uVar7 = uVar4 * 2;
    if (uVar7 < s || uVar7 - s == 0) {
      uVar7 = s;
    }
    uVar5 = uVar7 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      ppTVar3 = (Term **)FixedSizeAllocator<8UL>::alloc
                                   ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar5 < 0x11) {
      ppTVar3 = (Term **)FixedSizeAllocator<16UL>::alloc
                                   ((FixedSizeAllocator<16UL> *)
                                    (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar5 < 0x19) {
      ppTVar3 = (Term **)FixedSizeAllocator<24UL>::alloc
                                   ((FixedSizeAllocator<24UL> *)
                                    (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar5 < 0x21) {
      ppTVar3 = (Term **)FixedSizeAllocator<32UL>::alloc
                                   ((FixedSizeAllocator<32UL> *)
                                    (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar5 < 0x31) {
      ppTVar3 = (Term **)FixedSizeAllocator<48UL>::alloc
                                   ((FixedSizeAllocator<48UL> *)
                                    (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar5 < 0x41) {
      ppTVar3 = (Term **)FixedSizeAllocator<64UL>::alloc
                                   ((FixedSizeAllocator<64UL> *)
                                    (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      ppTVar3 = (Term **)::operator_new(uVar5,0x10);
    }
    sVar1 = this->_size;
    ppTVar2 = this->_array;
    this->_capacity = uVar7;
    this->_array = ppTVar3;
    __s = ppTVar3;
    if (sVar1 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)ppTVar3 + lVar6) = *(undefined8 *)((long)ppTVar2 + lVar6);
        lVar6 = lVar6 + 8;
      } while (sVar1 << 3 != lVar6);
      __s = (Term **)(lVar6 + (long)ppTVar3);
    }
    if (__s != ppTVar3 + uVar7) {
      memset(__s,0,((long)ppTVar3 + (uVar7 * 8 - (long)__s) + -8 & 0xfffffffffffffff8) + 8);
    }
    this->_size = s;
    if (ppTVar2 != (Term **)0x0) {
      uVar4 = uVar4 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *ppTVar2 = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppTVar2;
      }
      else if (uVar4 < 0x11) {
        *ppTVar2 = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppTVar2;
      }
      else if (uVar4 < 0x19) {
        *ppTVar2 = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppTVar2;
      }
      else if (uVar4 < 0x21) {
        *ppTVar2 = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppTVar2;
      }
      else if (uVar4 < 0x31) {
        *ppTVar2 = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppTVar2;
      }
      else {
        if (0x40 < uVar4) {
          operator_delete(ppTVar2,0x10);
          return;
        }
        *ppTVar2 = (Term *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppTVar2;
      }
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }